

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O1

void emit_movrr(ASMState *as,IRIns *ir,Reg dst,Reg src)

{
  MCode *pMVar1;
  uint uVar2;
  uint uVar3;
  
  if (dst < 0x10) {
    uVar2._0_2_ = *(IROpT *)((long)ir + 4);
    uVar2._2_2_ = *(IRRef1 *)((long)ir + 6);
    uVar3 = -(uint)((0x605fd9U >> (uVar2 & 0x1f) & 1) != 0) & 0x80200;
    pMVar1 = as->mcp;
    pMVar1[-1] = ((byte)src & 7) + (char)dst * '\b' | 0xc0;
    pMVar1[-2] = 0x8b;
    uVar2 = src >> 3 & 1 | (uVar3 | dst) >> 1 & 0x104;
    if (uVar2 == 0) {
      pMVar1 = pMVar1 + -2;
      goto LAB_00142c02;
    }
    pMVar1[-3] = (byte)uVar2 | (byte)(uVar3 >> 0x10) | 0x40;
  }
  else {
    pMVar1 = as->mcp;
    pMVar1[-1] = ((byte)src & 7) + (char)dst * '\b' | 0xc0;
    pMVar1[-3] = '\x0f';
    pMVar1[-2] = '(';
    uVar2 = src >> 3 & 1 | dst >> 1 & 0x104;
    if (uVar2 != 0) {
      pMVar1[-4] = (byte)uVar2 | (byte)(dst >> 0x10) | 0x40;
      pMVar1 = pMVar1 + -4;
      goto LAB_00142c02;
    }
  }
  pMVar1 = pMVar1 + -3;
LAB_00142c02:
  as->mcp = pMVar1;
  return;
}

Assistant:

static void emit_movrr(ASMState *as, IRIns *ir, Reg dst, Reg src)
{
  UNUSED(ir);
  if (dst < RID_MAX_GPR)
    emit_rr(as, XO_MOV, REX_64IR(ir, dst), src);
  else
    emit_rr(as, XO_MOVAPS, dst, src);
}